

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::
Parser<google::protobuf::internal::MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
                 *this,char *ptr,ParseContext *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  byte bVar1;
  size_type sVar2;
  bool bVar3;
  Value *pVVar4;
  MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *pMVar5;
  ValueMapEntryAccessorType *dest;
  uint size;
  char *ptr_00;
  Arena *arena;
  string *this_00;
  KeyOnMemory *this_01;
  pair<const_char_*,_int> pVar6;
  char *local_30;
  char *ptr_local;
  
  local_30 = ptr;
  bVar3 = EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,&local_30,ctx->group_depth_);
  if (bVar3) {
    if (local_30 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else if (*local_30 == '\n') {
    bVar1 = local_30[1];
    size = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar6 = ReadSizeFallback(local_30 + 1,(uint)bVar1);
      size = pVar6.second;
      ptr_00 = pVar6.first;
      if (ptr_00 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      ptr_00 = local_30 + 2;
    }
    s = &this->key_;
    local_30 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,ptr_00,size,s);
    if (local_30 == (char *)0x0) {
      return (char *)0x0;
    }
    bVar3 = WireFormatLite::VerifyUtf8String
                      ((this->key_)._M_dataplus._M_p,(int)(this->key_)._M_string_length,PARSE,
                       "google.protobuf.Struct.FieldsEntry.key");
    if (!bVar3) {
      return (char *)0x0;
    }
    bVar3 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,&local_30,ctx->group_depth_);
    if (bVar3) {
      if (local_30 == (char *)0x0) {
        return (char *)0x0;
      }
LAB_0020c6b1:
      pMVar5 = (MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                *)Arena::CreateMaybeMessage<google::protobuf::Struct_FieldsEntry_DoNotUse>
                            ((this->mf_->map_).arena_);
      this->entry_ = pMVar5;
    }
    else {
      if (*local_30 != '\x12') goto LAB_0020c6b1;
      sVar2 = this->map_->elements_->num_elements_;
      pVVar4 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
               ::operator[](this->map_,s);
      this->value_ptr_ = pVVar4;
      if (sVar2 == this->map_->elements_->num_elements_) goto LAB_0020c6b1;
      local_30 = ParseContext::ParseMessage<google::protobuf::Value>(ctx,pVVar4,local_30 + 1);
      if (local_30 == (char *)0x0) {
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
        ::erase(this->map_,s);
        return (char *)0x0;
      }
      bVar3 = EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,&local_30,ctx->group_depth_);
      if (bVar3) {
        return local_30;
      }
      if (local_30 == (char *)0x0) {
        return (char *)0x0;
      }
      pMVar5 = (MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                *)Arena::CreateMaybeMessage<google::protobuf::Struct_FieldsEntry_DoNotUse>
                            ((this->mf_->map_).arena_);
      this->entry_ = pMVar5;
      pVVar4 = this->value_ptr_;
      dest = mutable_value(pMVar5);
      MoveHelper<false,_true,_true,_google::protobuf::Value>::Move(pVVar4,dest);
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
      ::erase(this->map_,s);
      pMVar5 = this->entry_;
    }
    *(byte *)pMVar5->_has_bits_ = (byte)pMVar5->_has_bits_[0] | 1;
    arena = (Arena *)(((MapEntry<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                        *)&pMVar5->super_Message)->
                     super_MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                     ).super_Message.super_MessageLite._internal_metadata_.ptr_;
    this_01 = &pMVar5->key_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    this_00 = this_01->ptr_;
    if (this_00 == (string *)&fixed_address_empty_string_abi_cxx11_) {
      ArenaStringPtr::CreateInstance(this_01,arena,(string *)&fixed_address_empty_string_abi_cxx11_)
      ;
      this_00 = this_01->ptr_;
    }
    std::__cxx11::string::operator=((string *)this_00,(string *)s);
    pMVar5 = this->entry_;
    goto LAB_0020c708;
  }
  pMVar5 = (MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
            *)Arena::CreateMaybeMessage<google::protobuf::Struct_FieldsEntry_DoNotUse>
                        ((this->mf_->map_).arena_);
  this->entry_ = pMVar5;
LAB_0020c708:
  local_30 = MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
             ::_InternalParse(pMVar5,local_30,ctx);
  if (local_30 == (char *)0x0) {
    return (char *)0x0;
  }
  UseKeyAndValueFromEntry(this);
  return local_30;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }